

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

GreaterEqualLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_greaterequal(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  GreaterEqualLayerParams *pGVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_greaterequal(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_greaterequal(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pGVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::GreaterEqualLayerParams>(arena);
    (this->layer_).greaterequal_ = pGVar2;
  }
  return (GreaterEqualLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::GreaterEqualLayerParams* NeuralNetworkLayer::_internal_mutable_greaterequal() {
  if (!_internal_has_greaterequal()) {
    clear_layer();
    set_has_greaterequal();
    layer_.greaterequal_ = CreateMaybeMessage< ::CoreML::Specification::GreaterEqualLayerParams >(GetArenaForAllocation());
  }
  return layer_.greaterequal_;
}